

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::const_get_prop
              (vm_val_t *retval,vm_val_t *self_val,char *str,vm_prop_id_t prop,vm_obj_id_t *src_obj,
              uint *argc)

{
  uint uVar1;
  int iVar2;
  char *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  undefined4 *in_R8;
  CVmMetaTable *in_R9;
  vm_val_t *unaff_retaddr;
  uint func_idx;
  vm_prop_id_t in_stack_ffffffffffffffc2;
  uint in_stack_ffffffffffffffc4;
  vm_obj_id_t in_stack_fffffffffffffffc;
  
  *in_R8 = 0;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  uVar1 = CVmMetaTable::prop_to_vector_idx
                    (in_R9,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc2);
  iVar2 = (*func_table_[uVar1])(in_RDI,in_RSI,in_RDX,(uint *)in_R9);
  if (iVar2 == 0) {
    if (in_RSI->typ != VM_OBJ) {
      vm_objp(0);
      iVar2 = CVmObject::get_prop((CVmObject *)argc,func_idx._2_2_,unaff_retaddr,
                                  in_stack_fffffffffffffffc,&in_RDI->typ,&in_RSI->typ);
      if (iVar2 != 0) {
        return 1;
      }
    }
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CVmObjString::const_get_prop(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val, const char *str,
                                 vm_prop_id_t prop, vm_obj_id_t *src_obj,
                                 uint *argc)
{
    /* presume no source object */
    *src_obj = VM_INVALID_OBJ;

    /* translate the property index to an index into our function table */
    uint func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* call the appropriate function */
    if ((*func_table_[func_idx])(vmg_ retval, self_val, str, argc))
        return TRUE;

    /* 
     *   If this is a constant string (which is indicated by an invalid
     *   'self' object ID), try inheriting the default object
     *   interpretation, passing the constant string placeholder object
     *   for its type information.  
     */
    if (self_val->typ != VM_OBJ)
    {
        /* try going to CVmObject directly */
        if (vm_objp(vmg_ G_predef->const_str_obj)
            ->CVmObject::get_prop(vmg_ prop, retval, G_predef->const_str_obj,
                                  src_obj, argc))
            return TRUE;
    }

    /* not handled */
    return FALSE;
}